

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::writeSysex(Synth *this,Bit8u device,Bit8u *sysex,Bit32u len)

{
  byte bVar1;
  byte bVar2;
  Extensions *pEVar3;
  uint uVar4;
  byte bVar5;
  Bit32u addr;
  Bit32u len_00;
  Bit32u partIx;
  long lVar6;
  int iVar7;
  uint uVar8;
  Bit8u *sysex_00;
  
  if ((len == 0) || (this->opened == false)) {
    return;
  }
  pEVar3 = this->extensions;
  if (*sysex == '\x7f') {
    if (pEVar3->oldMT32DisplayFeatures == false) {
      Display::midiMessagePlayed(pEVar3->display);
    }
    reset(this);
    return;
  }
  Display::midiMessagePlayed(pEVar3->display);
  (*this->reportHandler->_vptr_ReportHandler[6])();
  bVar1 = *sysex;
  if (len < 3) {
    if (bVar1 == 0x20) {
      Display::displayControlMessageReceived(this->extensions->display,sysex,len);
      return;
    }
    printDebug(this,"writeSysex: Message is too short (%d bytes)!",(ulong)len);
    return;
  }
  uVar4 = (bVar1 & 0x7f) * 0x4000;
  uVar8 = sysex[2] & 0x7f | (sysex[1] & 0x7f) << 7;
  addr = uVar8 + uVar4;
  sysex_00 = sysex + 3;
  len_00 = len - 3;
  if (0xf < device) goto LAB_00115100;
  if ((bVar1 & 0x7f) == 0) {
    addr = uVar8 | 0xc000;
    pEVar3 = this->extensions;
    bVar1 = pEVar3->chantable[device][0];
    if (8 < bVar1) goto LAB_00115100;
    lVar6 = 0;
    do {
      bVar2 = pEVar3->chantable[device][lVar6];
      if (8 < bVar2) break;
      bVar5 = bVar2 << 4;
      if (bVar2 == 8) {
        bVar5 = 0;
      }
      writeSysexGlobal(this,bVar5 + addr,sysex_00,len_00);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 9);
  }
  else {
    if (uVar4 < 0x8000) {
      addr = addr + 0x8090;
      goto LAB_00115100;
    }
    if (0xbfff < uVar4) {
      return;
    }
    addr = addr + 0x8000;
    pEVar3 = this->extensions;
    bVar1 = pEVar3->chantable[device][0];
    if (8 < bVar1) goto LAB_00115100;
    lVar6 = 0;
    do {
      bVar2 = pEVar3->chantable[device][lVar6];
      if (8 < bVar2) break;
      iVar7 = (uint)bVar2 * 0xf6;
      if (bVar2 == 8) {
        iVar7 = 0;
      }
      writeSysexGlobal(this,iVar7 + addr,sysex_00,len_00);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 9);
  }
  if (bVar1 < 9) {
    return;
  }
LAB_00115100:
  writeSysexGlobal(this,addr,sysex_00,len_00);
  return;
}

Assistant:

void Synth::writeSysex(Bit8u device, const Bit8u *sysex, Bit32u len) {
	if (!opened || len < 1) return;

	// This is checked early in the real devices (before any sysex length checks or further processing)
	if (sysex[0] == 0x7F) {
		if (!isDisplayOldMT32Compatible()) extensions.display->midiMessagePlayed();
		reset();
		return;
	}

	extensions.display->midiMessagePlayed();
	reportHandler->onMIDIMessagePlayed();

	if (len < 3) {
		// A short message of just 1 or 2 bytes may be written to the display area yet it may cause a user-visible effect,
		// similarly to the reset area.
		if (sysex[0] == 0x20) {
			extensions.display->displayControlMessageReceived(sysex, len);
			return;
		}
		printDebug("writeSysex: Message is too short (%d bytes)!", len);
		return;
	}

	Bit32u addr = (sysex[0] << 16) | (sysex[1] << 8) | (sysex[2]);
	addr = MT32EMU_MEMADDR(addr);
	sysex += 3;
	len -= 3;

	//printDebug("Sysex addr: 0x%06x", MT32EMU_SYSEXMEMADDR(addr));
	// NOTE: Please keep both lower and upper bounds in each check, for ease of reading

	// Process channel-specific sysex by converting it to device-global
	if (device < 0x10) {
#if MT32EMU_MONITOR_SYSEX > 0
		printDebug("WRITE-CHANNEL: Channel %d temp area 0x%06x", device, MT32EMU_SYSEXMEMADDR(addr));
#endif
		if (/*addr >= MT32EMU_MEMADDR(0x000000) && */addr < MT32EMU_MEMADDR(0x010000)) {
			addr += MT32EMU_MEMADDR(0x030000);
			Bit8u *chanParts = extensions.chantable[device];
			if (*chanParts > 8) {
#if MT32EMU_MONITOR_SYSEX > 0
				printDebug(" (Channel not mapped to a part... 0 offset)");
#endif
			} else {
				for (Bit32u partIx = 0; partIx <= 8; partIx++) {
					if (chanParts[partIx] > 8) break;
					int offset;
					if (chanParts[partIx] == 8) {
#if MT32EMU_MONITOR_SYSEX > 0
						printDebug(" (Channel mapped to rhythm... 0 offset)");
#endif
						offset = 0;
					} else {
						offset = chanParts[partIx] * sizeof(MemParams::PatchTemp);
#if MT32EMU_MONITOR_SYSEX > 0
						printDebug(" (Setting extra offset to %d)", offset);
#endif
					}
					writeSysexGlobal(addr + offset, sysex, len);
				}
				return;
			}
		} else if (/*addr >= MT32EMU_MEMADDR(0x010000) && */ addr < MT32EMU_MEMADDR(0x020000)) {
			addr += MT32EMU_MEMADDR(0x030110) - MT32EMU_MEMADDR(0x010000);
		} else if (/*addr >= MT32EMU_MEMADDR(0x020000) && */ addr < MT32EMU_MEMADDR(0x030000)) {
			addr += MT32EMU_MEMADDR(0x040000) - MT32EMU_MEMADDR(0x020000);
			Bit8u *chanParts = extensions.chantable[device];
			if (*chanParts > 8) {
#if MT32EMU_MONITOR_SYSEX > 0
				printDebug(" (Channel not mapped to a part... 0 offset)");
#endif
			} else {
				for (Bit32u partIx = 0; partIx <= 8; partIx++) {
					if (chanParts[partIx] > 8) break;
					int offset;
					if (chanParts[partIx] == 8) {
#if MT32EMU_MONITOR_SYSEX > 0
						printDebug(" (Channel mapped to rhythm... 0 offset)");
#endif
						offset = 0;
					} else {
						offset = chanParts[partIx] * sizeof(TimbreParam);
#if MT32EMU_MONITOR_SYSEX > 0
						printDebug(" (Setting extra offset to %d)", offset);
#endif
					}
					writeSysexGlobal(addr + offset, sysex, len);
				}
				return;
			}
		} else {
#if MT32EMU_MONITOR_SYSEX > 0
			printDebug(" Invalid channel");
#endif
			return;
		}
	}
	writeSysexGlobal(addr, sysex, len);
}